

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_decorator.hpp
# Opt level: O0

void __thiscall ftxui::NodeDecorator::NodeDecorator(NodeDecorator *this,Element *child)

{
  shared_ptr<ftxui::Node> *args;
  shared_ptr<ftxui::Node> local_40;
  Elements local_30;
  Element *local_18;
  Element *child_local;
  NodeDecorator *this_local;
  
  local_18 = child;
  child_local = (Element *)this;
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_40,child);
  unpack<std::shared_ptr<ftxui::Node>>(&local_30,(ftxui *)&local_40,args);
  Node::Node(&this->super_Node,&local_30);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_30);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_40);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__NodeDecorator_0021a778;
  return;
}

Assistant:

NodeDecorator(Element child) : Node(unpack(std::move(child))) {}